

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

uint32_t compute_looped_frame_index
                   (uint32_t first_loop_frame,uint32_t last_loop_frame,uint32_t frame_index)

{
  uint uVar1;
  
  uVar1 = (last_loop_frame - first_loop_frame) + 1;
  if (frame_index < first_loop_frame) {
    uVar1 = last_loop_frame - (~frame_index + first_loop_frame) % uVar1;
  }
  else {
    uVar1 = (frame_index - first_loop_frame) % uVar1 + first_loop_frame;
  }
  if ((first_loop_frame <= uVar1) && (uVar1 <= last_loop_frame)) {
    return uVar1;
  }
  __assert_fail("(looped_frame_index >= first_loop_frame && looped_frame_index <= last_loop_frame) && (\"bug in looping logic!\")"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                ,0x4ed,"uint32_t compute_looped_frame_index(uint32_t, uint32_t, uint32_t)");
}

Assistant:

uint32_t compute_looped_frame_index(uint32_t first_loop_frame, uint32_t last_loop_frame, uint32_t frame_index)
    {
        uint32_t loop_len = 1 + last_loop_frame - first_loop_frame;
        uint32_t looped_frame_index;
        if (frame_index >= first_loop_frame) {
            uint32_t frames_since_first_frame = frame_index - first_loop_frame;
            looped_frame_index = first_loop_frame + (frames_since_first_frame % loop_len);
        }
        else {
            uint32_t frames_since_first_frame = (first_loop_frame - frame_index - 1);
            looped_frame_index = last_loop_frame - (frames_since_first_frame % loop_len);
        }
        ogt_assert(looped_frame_index >= first_loop_frame && looped_frame_index <= last_loop_frame, "bug in looping logic!");
        return looped_frame_index;
    }